

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_1a9;
  string ifwTmpFile;
  string ifwTLD;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifwTLD);
  poVar3 = std::operator<<((ostream *)&ifwTLD,"- Configuration");
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    this_00 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x1f,ifwTmpFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ifwTmpFile);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifwTLD);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ifwTmpFile,"CPACK_TOPLEVEL_DIRECTORY",&local_1a9);
  psVar4 = (string *)cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&ifwTmpFile);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&ifwTLD,(string *)psVar4);
  std::__cxx11::string::~string((string *)&ifwTmpFile);
  cmStrCat<std::__cxx11::string&,char_const(&)[15]>
            (&ifwTmpFile,&ifwTLD,(char (*) [15])"/IFWOutput.log");
  iVar2 = RunRepogen(this,&ifwTmpFile);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = RunBinaryCreator(this,&ifwTmpFile);
  }
  std::__cxx11::string::~string((string *)&ifwTmpFile);
  std::__cxx11::string::~string((string *)&ifwTLD);
  return iVar2;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackIFWLogger(OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  this->Installer.GenerateInstallerFile();

  // Packages configuration
  this->Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = cmStrCat(ifwTLD, "/IFWOutput.log");

  // Create repositories
  if (!this->RunRepogen(ifwTmpFile)) {
    return 0;
  }

  // Create installer
  if (!this->RunBinaryCreator(ifwTmpFile)) {
    return 0;
  }

  return 1;
}